

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roundtrip.cpp
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
(anonymous_namespace)::roundtrip<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,_anonymous_namespace_ *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in)

{
  long lVar1;
  Result *in_R9;
  uint32_t size;
  InputStream istream;
  OutputStream ostream;
  stringstream stream;
  undefined1 auStack_1f8 [12];
  ExpressionDecomposer local_1ec;
  ulong local_1e8;
  Expression_lhs<unsigned_long> local_1e0;
  Result local_1d0;
  OutputStream local_1b0;
  long local_1a8 [3];
  undefined4 auStack_18c [25];
  ios_base local_128 [264];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
  lVar1 = *(long *)(local_1a8[0] + -0x18);
  *(undefined4 *)((long)auStack_18c + lVar1) = 4;
  std::ios::clear((int)auStack_1f8 + (int)lVar1 + 0x50);
  local_1b0.stream = (stringstream *)local_1a8;
  mserialize::detail::
  BuiltinSerializer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  ::serialize<OutputStream>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,&local_1b0);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_1ec,DT_CHECK);
  local_1e0.lhs = std::ostream::tellp();
  local_1e0.m_at = local_1ec.m_at;
  local_1e8 = *(long *)(this + 8) + 4;
  doctest::detail::Expression_lhs<unsigned_long>::operator==(&local_1d0,&local_1e0,&local_1e8);
  doctest::detail::decomp_assert
            ((detail *)0xa,0x1b828c,(char *)0x36,0x1b84ed,&local_1d0.m_passed,in_R9);
  doctest::String::~String(&local_1d0.m_decomp);
  local_1e0.lhs = (unsigned_long)local_1a8;
  std::istream::read((char *)local_1a8,(long)&local_1e8);
  mserialize::detail::
  BuiltinDeserializer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  ::deserialize_elems<InputStream>(__return_storage_ptr__,local_1e8 & 0xffffffff,&local_1e0);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

T roundtrip(const T& in)
{
  T out;
  roundtrip_into(in, out);
  return out;
}